

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_grid.c
# Opt level: O1

REF_STATUS
ref_grid_node_list_around
          (REF_GRID ref_grid,REF_INT node,REF_INT max_node,REF_INT *nnode,REF_INT *node_list)

{
  int iVar1;
  REF_CELL pRVar2;
  REF_INT *pRVar3;
  REF_ADJ_ITEM pRVar4;
  int iVar5;
  int iVar6;
  REF_CELL *ppRVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  
  *nnode = 0;
  ppRVar7 = ref_grid->cell + 3;
  lVar8 = 3;
  do {
    pRVar2 = *ppRVar7;
    iVar5 = -1;
    uVar9 = 0xffffffff;
    if (-1 < node) {
      uVar9 = 0xffffffff;
      if (node < pRVar2->ref_adj->nnode) {
        uVar9 = (ulong)(uint)pRVar2->ref_adj->first[(uint)node];
      }
    }
    if ((int)uVar9 != -1) {
      iVar5 = pRVar2->ref_adj->item[(int)uVar9].ref;
    }
    while ((int)uVar9 != -1) {
      if (0 < pRVar2->node_per) {
        pRVar3 = pRVar2->c2n;
        iVar6 = 0;
        do {
          iVar1 = pRVar3[pRVar2->size_per * iVar5 + iVar6];
          if (iVar1 != node) {
            lVar10 = (long)*nnode;
            if (0 < lVar10) {
              lVar11 = 0;
              do {
                if (node_list[lVar11] == iVar1) goto LAB_0015ceb5;
                lVar11 = lVar11 + 1;
              } while (lVar10 != lVar11);
            }
            if (max_node <= *nnode) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c"
                     ,0x35f,"ref_grid_node_list_around",7,"max_node too small");
              return 7;
            }
            node_list[lVar10] = iVar1;
            *nnode = *nnode + 1;
          }
LAB_0015ceb5:
          iVar6 = iVar6 + 1;
        } while (iVar6 < pRVar2->node_per);
      }
      pRVar4 = pRVar2->ref_adj->item;
      uVar9 = (ulong)pRVar4[(int)uVar9].next;
      if (uVar9 == 0xffffffffffffffff) {
        iVar5 = -1;
      }
      else {
        iVar5 = pRVar4[uVar9].ref;
      }
    }
    ppRVar7 = ref_grid->cell + lVar8 + 1;
    lVar8 = lVar8 + 1;
    if (lVar8 == 0x10) {
      return 0;
    }
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_grid_node_list_around(REF_GRID ref_grid, REF_INT node,
                                             REF_INT max_node, REF_INT *nnode,
                                             REF_INT *node_list) {
  REF_INT cell, item, cell_node, haves, group;
  REF_CELL ref_cell;
  REF_BOOL already_have_it;

  *nnode = 0;
  each_ref_grid_2d_3d_ref_cell(ref_grid, group, ref_cell) {
    each_ref_cell_having_node(ref_cell, node, item, cell) {
      for (cell_node = 0; cell_node < ref_cell_node_per(ref_cell);
           cell_node++) {
        if (node == ref_cell_c2n(ref_cell, cell_node, cell)) continue;
        already_have_it = REF_FALSE;
        for (haves = 0; haves < *nnode; haves++)
          if (node_list[haves] == ref_cell_c2n(ref_cell, cell_node, cell)) {
            already_have_it = REF_TRUE;
            break;
          }
        if (!already_have_it) {
          if (*nnode >= max_node) {
            RSS(REF_INCREASE_LIMIT, "max_node too small");
          }
          node_list[*nnode] = ref_cell_c2n(ref_cell, cell_node, cell);
          (*nnode)++;
        }
      }
    }
  }

  return REF_SUCCESS;
}